

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

void __thiscall DSectorPlaneInterpolation::UpdateInterpolation(DSectorPlaneInterpolation *this)

{
  double dVar1;
  sector_t *psVar2;
  secplane_t *psVar3;
  splane *psVar4;
  
  psVar2 = this->sector;
  psVar3 = &psVar2->ceilingplane;
  psVar4 = psVar2->planes + 1;
  if (this->ceiling == false) {
    psVar3 = &psVar2->floorplane;
    psVar4 = psVar2->planes;
  }
  dVar1 = psVar4->TexZ;
  this->oldheight = psVar3->D;
  this->oldtexz = dVar1;
  return;
}

Assistant:

void DSectorPlaneInterpolation::UpdateInterpolation()
{
	if (!ceiling)
	{
		oldheight = sector->floorplane.fD();
		oldtexz = sector->GetPlaneTexZ(sector_t::floor);
	}
	else
	{
		oldheight = sector->ceilingplane.fD();
		oldtexz = sector->GetPlaneTexZ(sector_t::ceiling);
	}
}